

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O2

Status __thiscall leveldb::ReadFileToString(leveldb *this,Env *env,string *fname,string *data)

{
  char *pcVar1;
  void *pvVar2;
  Slice fragment;
  SequentialFile *file;
  Status local_50;
  char *local_48;
  long local_40;
  long *local_38;
  
  data->_M_string_length = 0;
  *(data->_M_dataplus)._M_p = '\0';
  (*env->_vptr_Env[2])();
  if (*(long *)this == 0) {
    pvVar2 = operator_new__(0x2000);
    do {
      local_48 = "";
      local_40 = 0;
      (**(code **)(*local_38 + 0x10))(&local_50,local_38,0x2000,&local_48,pvVar2);
      pcVar1 = *(char **)this;
      *(char **)this = local_50.state_;
      local_50.state_ = pcVar1;
      Status::~Status(&local_50);
      if (*(long *)this != 0) break;
      std::__cxx11::string::append((char *)data,(ulong)local_48);
    } while (local_40 != 0);
    operator_delete__(pvVar2);
    if (local_38 != (long *)0x0) {
      (**(code **)(*local_38 + 8))();
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status ReadFileToString(Env* env, const std::string& fname, std::string* data) {
  data->clear();
  SequentialFile* file;
  Status s = env->NewSequentialFile(fname, &file);
  if (!s.ok()) {
    return s;
  }
  static const int kBufferSize = 8192;
  char* space = new char[kBufferSize];
  while (true) {
    Slice fragment;
    s = file->Read(kBufferSize, &fragment, space);
    if (!s.ok()) {
      break;
    }
    data->append(fragment.data(), fragment.size());
    if (fragment.empty()) {
      break;
    }
  }
  delete[] space;
  delete file;
  return s;
}